

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanUploadHeap.cpp
# Opt level: O3

void __thiscall Diligent::VulkanUploadHeap::~VulkanUploadHeap(VulkanUploadHeap *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  char (*in_R8) [29];
  char **in_stack_ffffffffffffff80;
  string msg;
  char *local_50;
  VkDeviceSize PeakAllocatedPages;
  ulong local_40;
  undefined4 local_38;
  undefined8 local_30;
  VkDeviceSize local_28;
  char local_20 [8];
  ulong local_18;
  
  if ((this->m_Pages).
      super__Vector_base<Diligent::VulkanUploadHeap::UploadPageInfo,_std::allocator<Diligent::VulkanUploadHeap::UploadPageInfo>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->m_Pages).
      super__Vector_base<Diligent::VulkanUploadHeap::UploadPageInfo,_std::allocator<Diligent::VulkanUploadHeap::UploadPageInfo>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    FormatString<char[14],std::__cxx11::string,char[29]>
              (&msg,(Diligent *)"Upload heap \'",(char (*) [14])&this->m_HeapName,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               "\' not all pages are released",in_R8);
    in_stack_ffffffffffffff80 = (char **)0x279dbf;
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"~VulkanUploadHeap",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUploadHeap.cpp"
               ,0x30);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      in_stack_ffffffffffffff80 = (char **)0x279dda;
      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
    }
  }
  local_40 = this->m_PeakAllocatedSize;
  PeakAllocatedPages = local_40 / this->m_PageSize;
  local_28 = this->m_PeakFrameSize;
  local_20[0] = '\x02';
  local_20[1] = '\0';
  local_20[2] = '\0';
  local_20[3] = '\0';
  local_38 = 2;
  local_30 = 0;
  local_50 = " pages)";
  if (PeakAllocatedPages == 1) {
    local_50 = " page)";
  }
  local_18 = local_40;
  FormatString<std::__cxx11::string,char[34],Diligent::MemorySizeFormatter<unsigned_long>,char[4],Diligent::MemorySizeFormatter<unsigned_long>,char[3],unsigned_long,char_const*>
            (&msg,(Diligent *)&this->m_HeapName,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             " peak used/allocated frame size: ",(char (*) [34])&local_28,
             (MemorySizeFormatter<unsigned_long> *)" / ",(char (*) [4])&local_40,
             (MemorySizeFormatter<unsigned_long> *)0x6b3b90,(char (*) [3])&PeakAllocatedPages,
             (unsigned_long *)&local_50,in_stack_ffffffffffffff80);
  if (DebugMessageCallback != (undefined *)0x0) {
    (*(code *)DebugMessageCallback)(0,msg._M_dataplus._M_p,0,0,0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)msg._M_dataplus._M_p != &msg.field_2) {
    operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<Diligent::VulkanUploadHeap::UploadPageInfo,_std::allocator<Diligent::VulkanUploadHeap::UploadPageInfo>_>
  ::~vector(&this->m_Pages);
  pcVar1 = (this->m_HeapName)._M_dataplus._M_p;
  paVar2 = &(this->m_HeapName).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
  }
  return;
}

Assistant:

VulkanUploadHeap::~VulkanUploadHeap()
{
    DEV_CHECK_ERR(m_Pages.empty(), "Upload heap '", m_HeapName, "' not all pages are released");
    auto PeakAllocatedPages = m_PeakAllocatedSize / m_PageSize;
    LOG_INFO_MESSAGE(m_HeapName, " peak used/allocated frame size: ", FormatMemorySize(m_PeakFrameSize, 2, m_PeakAllocatedSize),
                     " / ", FormatMemorySize(m_PeakAllocatedSize, 2),
                     " (", PeakAllocatedPages, (PeakAllocatedPages == 1 ? " page)" : " pages)"));
}